

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage::allocateFromHole
          (DataLocationUsage *this,Group *group,DataLocation *location,uint lgSize)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uint uVar30;
  uint uVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  byte bVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar57;
  int iVar60;
  int iVar61;
  undefined1 auVar58 [16];
  int iVar62;
  undefined1 auVar59 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  int iVar76;
  int iVar80;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  uchar local_2a;
  byte local_29;
  
  auVar29 = _DAT_00264710;
  auVar28 = _DAT_00264700;
  auVar27 = _DAT_002646f0;
  auVar26 = _DAT_002646e0;
  auVar25 = _DAT_002646d0;
  auVar24 = _DAT_002646c0;
  auVar23 = _DAT_002646b0;
  bVar35 = (byte)lgSize;
  if (this->isUsed == false) {
    this->isUsed = true;
    this->lgSizeUsed = bVar35;
    uVar31 = 0;
  }
  else {
    bVar1 = this->lgSizeUsed;
    uVar36 = (ulong)bVar1;
    if (lgSize < bVar1) {
      HoleSet<unsigned_char>::tryAllocate((HoleSet<unsigned_char> *)&local_2a,(uchar)&this->holes);
      if (local_2a == '\x01') {
        uVar31 = (uint)local_29;
      }
      else {
        bVar1 = this->lgSizeUsed;
        uVar31 = 1 << (bVar1 - bVar35 & 0x1f);
        if (bVar35 < bVar1) {
          uVar30 = uVar31 + 1;
          uVar36 = (ulong)lgSize;
          do {
            (this->holes).holes[uVar36] = (uchar)uVar30;
            uVar36 = uVar36 + 1;
            uVar30 = (uVar30 & 0xff) + 1 >> 1;
          } while (bVar1 != uVar36);
        }
        this->lgSizeUsed = bVar1 + 1;
      }
    }
    else {
      if (bVar1 < bVar35) {
        lVar32 = (lgSize & 0xff) - uVar36;
        lVar33 = lVar32 + -1;
        auVar37._8_4_ = (int)lVar33;
        auVar37._0_8_ = lVar33;
        auVar37._12_4_ = (int)((ulong)lVar33 >> 0x20);
        uVar34 = 0;
        do {
          auVar55._8_4_ = (int)uVar34;
          auVar55._0_8_ = uVar34;
          auVar55._12_4_ = (int)(uVar34 >> 0x20);
          auVar58 = auVar37 ^ auVar29;
          auVar63 = (auVar55 | auVar28) ^ auVar29;
          iVar57 = auVar58._0_4_;
          iVar76 = -(uint)(iVar57 < auVar63._0_4_);
          iVar60 = auVar58._4_4_;
          auVar65._4_4_ = -(uint)(iVar60 < auVar63._4_4_);
          iVar61 = auVar58._8_4_;
          iVar80 = -(uint)(iVar61 < auVar63._8_4_);
          iVar62 = auVar58._12_4_;
          auVar65._12_4_ = -(uint)(iVar62 < auVar63._12_4_);
          auVar38._4_4_ = iVar76;
          auVar38._0_4_ = iVar76;
          auVar38._8_4_ = iVar80;
          auVar38._12_4_ = iVar80;
          auVar38 = pshuflw(in_XMM1,auVar38,0xe8);
          auVar64._4_4_ = -(uint)(auVar63._4_4_ == iVar60);
          auVar64._12_4_ = -(uint)(auVar63._12_4_ == iVar62);
          auVar64._0_4_ = auVar64._4_4_;
          auVar64._8_4_ = auVar64._12_4_;
          auVar47 = pshuflw(in_XMM2,auVar64,0xe8);
          auVar65._0_4_ = auVar65._4_4_;
          auVar65._8_4_ = auVar65._12_4_;
          auVar63 = pshuflw(auVar38,auVar65,0xe8);
          auVar58._8_4_ = 0xffffffff;
          auVar58._0_8_ = 0xffffffffffffffff;
          auVar58._12_4_ = 0xffffffff;
          auVar58 = (auVar63 | auVar47 & auVar38) ^ auVar58;
          auVar58 = packssdw(auVar58,auVar58);
          if ((auVar58 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            (this->holes).holes[uVar34 + uVar36] = '\x01';
          }
          auVar47._4_4_ = iVar76;
          auVar47._0_4_ = iVar76;
          auVar47._8_4_ = iVar80;
          auVar47._12_4_ = iVar80;
          auVar65 = auVar64 & auVar47 | auVar65;
          auVar58 = packssdw(auVar65,auVar65);
          auVar63._8_4_ = 0xffffffff;
          auVar63._0_8_ = 0xffffffffffffffff;
          auVar63._12_4_ = 0xffffffff;
          auVar58 = packssdw(auVar58 ^ auVar63,auVar58 ^ auVar63);
          auVar58 = packsswb(auVar58,auVar58);
          if ((auVar58._0_4_ >> 8 & 1) != 0) {
            (this->holes).holes[uVar34 + uVar36 + 1] = '\x01';
          }
          auVar58 = (auVar55 | auVar27) ^ auVar29;
          auVar48._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
          auVar48._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
          auVar48._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
          auVar48._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
          auVar66._4_4_ = auVar48._0_4_;
          auVar66._0_4_ = auVar48._0_4_;
          auVar66._8_4_ = auVar48._8_4_;
          auVar66._12_4_ = auVar48._8_4_;
          iVar76 = -(uint)(auVar58._4_4_ == iVar60);
          iVar80 = -(uint)(auVar58._12_4_ == iVar62);
          auVar11._4_4_ = iVar76;
          auVar11._0_4_ = iVar76;
          auVar11._8_4_ = iVar80;
          auVar11._12_4_ = iVar80;
          auVar77._4_4_ = auVar48._4_4_;
          auVar77._0_4_ = auVar48._4_4_;
          auVar77._8_4_ = auVar48._12_4_;
          auVar77._12_4_ = auVar48._12_4_;
          auVar58 = auVar11 & auVar66 | auVar77;
          auVar58 = packssdw(auVar58,auVar58);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar58 = packssdw(auVar58 ^ auVar2,auVar58 ^ auVar2);
          auVar58 = packsswb(auVar58,auVar58);
          if ((auVar58._0_4_ >> 0x10 & 1) != 0) {
            (this->holes).holes[uVar34 + uVar36 + 2] = '\x01';
          }
          auVar58 = pshufhw(auVar58,auVar66,0x84);
          auVar12._4_4_ = iVar76;
          auVar12._0_4_ = iVar76;
          auVar12._8_4_ = iVar80;
          auVar12._12_4_ = iVar80;
          auVar63 = pshufhw(auVar48,auVar12,0x84);
          auVar38 = pshufhw(auVar58,auVar77,0x84);
          auVar39._8_4_ = 0xffffffff;
          auVar39._0_8_ = 0xffffffffffffffff;
          auVar39._12_4_ = 0xffffffff;
          auVar39 = (auVar38 | auVar63 & auVar58) ^ auVar39;
          auVar58 = packssdw(auVar39,auVar39);
          auVar58 = packsswb(auVar58,auVar58);
          if ((auVar58._0_4_ >> 0x18 & 1) != 0) {
            (this->holes).holes[uVar34 + uVar36 + 3] = '\x01';
          }
          auVar58 = (auVar55 | auVar26) ^ auVar29;
          auVar49._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
          auVar49._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
          auVar49._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
          auVar49._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
          auVar13._4_4_ = auVar49._0_4_;
          auVar13._0_4_ = auVar49._0_4_;
          auVar13._8_4_ = auVar49._8_4_;
          auVar13._12_4_ = auVar49._8_4_;
          auVar63 = pshuflw(auVar77,auVar13,0xe8);
          auVar40._0_4_ = -(uint)(auVar58._0_4_ == iVar57);
          auVar40._4_4_ = -(uint)(auVar58._4_4_ == iVar60);
          auVar40._8_4_ = -(uint)(auVar58._8_4_ == iVar61);
          auVar40._12_4_ = -(uint)(auVar58._12_4_ == iVar62);
          auVar67._4_4_ = auVar40._4_4_;
          auVar67._0_4_ = auVar40._4_4_;
          auVar67._8_4_ = auVar40._12_4_;
          auVar67._12_4_ = auVar40._12_4_;
          auVar58 = pshuflw(auVar40,auVar67,0xe8);
          auVar68._4_4_ = auVar49._4_4_;
          auVar68._0_4_ = auVar49._4_4_;
          auVar68._8_4_ = auVar49._12_4_;
          auVar68._12_4_ = auVar49._12_4_;
          auVar38 = pshuflw(auVar49,auVar68,0xe8);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar58 = packssdw(auVar58 & auVar63,(auVar38 | auVar58 & auVar63) ^ auVar3);
          auVar58 = packsswb(auVar58,auVar58);
          if ((auVar58 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            (this->holes).holes[uVar34 + uVar36 + 4] = '\x01';
          }
          auVar14._4_4_ = auVar49._0_4_;
          auVar14._0_4_ = auVar49._0_4_;
          auVar14._8_4_ = auVar49._8_4_;
          auVar14._12_4_ = auVar49._8_4_;
          auVar68 = auVar67 & auVar14 | auVar68;
          auVar38 = packssdw(auVar68,auVar68);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar58 = packssdw(auVar58,auVar38 ^ auVar4);
          auVar58 = packsswb(auVar58,auVar58);
          if ((auVar58._4_2_ >> 8 & 1) != 0) {
            (this->holes).holes[uVar34 + uVar36 + 5] = '\x01';
          }
          auVar58 = (auVar55 | auVar25) ^ auVar29;
          auVar50._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
          auVar50._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
          auVar50._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
          auVar50._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
          auVar69._4_4_ = auVar50._0_4_;
          auVar69._0_4_ = auVar50._0_4_;
          auVar69._8_4_ = auVar50._8_4_;
          auVar69._12_4_ = auVar50._8_4_;
          iVar76 = -(uint)(auVar58._4_4_ == iVar60);
          iVar80 = -(uint)(auVar58._12_4_ == iVar62);
          auVar15._4_4_ = iVar76;
          auVar15._0_4_ = iVar76;
          auVar15._8_4_ = iVar80;
          auVar15._12_4_ = iVar80;
          auVar78._4_4_ = auVar50._4_4_;
          auVar78._0_4_ = auVar50._4_4_;
          auVar78._8_4_ = auVar50._12_4_;
          auVar78._12_4_ = auVar50._12_4_;
          auVar58 = auVar15 & auVar69 | auVar78;
          auVar58 = packssdw(auVar58,auVar58);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar58 = packssdw(auVar58 ^ auVar5,auVar58 ^ auVar5);
          auVar58 = packsswb(auVar58,auVar58);
          if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            this[1].holes.holes[uVar34 + uVar36 + -2] = '\x01';
          }
          auVar58 = pshufhw(auVar58,auVar69,0x84);
          auVar16._4_4_ = iVar76;
          auVar16._0_4_ = iVar76;
          auVar16._8_4_ = iVar80;
          auVar16._12_4_ = iVar80;
          auVar63 = pshufhw(auVar50,auVar16,0x84);
          auVar38 = pshufhw(auVar58,auVar78,0x84);
          auVar41._8_4_ = 0xffffffff;
          auVar41._0_8_ = 0xffffffffffffffff;
          auVar41._12_4_ = 0xffffffff;
          auVar41 = (auVar38 | auVar63 & auVar58) ^ auVar41;
          auVar58 = packssdw(auVar41,auVar41);
          auVar58 = packsswb(auVar58,auVar58);
          if ((auVar58._6_2_ >> 8 & 1) != 0) {
            this[1].holes.holes[uVar34 + uVar36 + -1] = '\x01';
          }
          auVar58 = (auVar55 | auVar24) ^ auVar29;
          auVar51._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
          auVar51._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
          auVar51._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
          auVar51._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
          auVar17._4_4_ = auVar51._0_4_;
          auVar17._0_4_ = auVar51._0_4_;
          auVar17._8_4_ = auVar51._8_4_;
          auVar17._12_4_ = auVar51._8_4_;
          auVar63 = pshuflw(auVar78,auVar17,0xe8);
          auVar42._0_4_ = -(uint)(auVar58._0_4_ == iVar57);
          auVar42._4_4_ = -(uint)(auVar58._4_4_ == iVar60);
          auVar42._8_4_ = -(uint)(auVar58._8_4_ == iVar61);
          auVar42._12_4_ = -(uint)(auVar58._12_4_ == iVar62);
          auVar70._4_4_ = auVar42._4_4_;
          auVar70._0_4_ = auVar42._4_4_;
          auVar70._8_4_ = auVar42._12_4_;
          auVar70._12_4_ = auVar42._12_4_;
          auVar58 = pshuflw(auVar42,auVar70,0xe8);
          auVar71._4_4_ = auVar51._4_4_;
          auVar71._0_4_ = auVar51._4_4_;
          auVar71._8_4_ = auVar51._12_4_;
          auVar71._12_4_ = auVar51._12_4_;
          auVar38 = pshuflw(auVar51,auVar71,0xe8);
          auVar52._8_4_ = 0xffffffff;
          auVar52._0_8_ = 0xffffffffffffffff;
          auVar52._12_4_ = 0xffffffff;
          auVar52 = (auVar38 | auVar58 & auVar63) ^ auVar52;
          auVar38 = packssdw(auVar52,auVar52);
          auVar58 = packsswb(auVar58 & auVar63,auVar38);
          if ((auVar58 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            this[1].holes.holes[uVar34 + uVar36] = '\x01';
          }
          auVar18._4_4_ = auVar51._0_4_;
          auVar18._0_4_ = auVar51._0_4_;
          auVar18._8_4_ = auVar51._8_4_;
          auVar18._12_4_ = auVar51._8_4_;
          auVar71 = auVar70 & auVar18 | auVar71;
          auVar38 = packssdw(auVar71,auVar71);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar38 = packssdw(auVar38 ^ auVar6,auVar38 ^ auVar6);
          auVar58 = packsswb(auVar58,auVar38);
          if ((auVar58._8_2_ >> 8 & 1) != 0) {
            this[1].holes.holes[uVar34 + uVar36 + 1] = '\x01';
          }
          auVar58 = (auVar55 | auVar23) ^ auVar29;
          auVar53._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
          auVar53._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
          auVar53._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
          auVar53._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
          auVar72._4_4_ = auVar53._0_4_;
          auVar72._0_4_ = auVar53._0_4_;
          auVar72._8_4_ = auVar53._8_4_;
          auVar72._12_4_ = auVar53._8_4_;
          iVar76 = -(uint)(auVar58._4_4_ == iVar60);
          iVar80 = -(uint)(auVar58._12_4_ == iVar62);
          auVar19._4_4_ = iVar76;
          auVar19._0_4_ = iVar76;
          auVar19._8_4_ = iVar80;
          auVar19._12_4_ = iVar80;
          auVar79._4_4_ = auVar53._4_4_;
          auVar79._0_4_ = auVar53._4_4_;
          auVar79._8_4_ = auVar53._12_4_;
          auVar79._12_4_ = auVar53._12_4_;
          auVar58 = auVar19 & auVar72 | auVar79;
          auVar58 = packssdw(auVar58,auVar58);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar58 = packssdw(auVar58 ^ auVar7,auVar58 ^ auVar7);
          auVar58 = packsswb(auVar58,auVar58);
          if ((auVar58 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            this[1].holes.holes[uVar34 + uVar36 + 2] = '\x01';
          }
          auVar58 = pshufhw(auVar58,auVar72,0x84);
          auVar20._4_4_ = iVar76;
          auVar20._0_4_ = iVar76;
          auVar20._8_4_ = iVar80;
          auVar20._12_4_ = iVar80;
          auVar63 = pshufhw(auVar53,auVar20,0x84);
          auVar38 = pshufhw(auVar58,auVar79,0x84);
          auVar43._8_4_ = 0xffffffff;
          auVar43._0_8_ = 0xffffffffffffffff;
          auVar43._12_4_ = 0xffffffff;
          auVar43 = (auVar38 | auVar63 & auVar58) ^ auVar43;
          auVar58 = packssdw(auVar43,auVar43);
          auVar58 = packsswb(auVar58,auVar58);
          if ((auVar58._10_2_ >> 8 & 1) != 0) {
            this[1].holes.holes[uVar34 + uVar36 + 3] = '\x01';
          }
          auVar58 = (auVar55 | _DAT_002646a0) ^ auVar29;
          auVar54._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
          auVar54._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
          auVar54._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
          auVar54._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
          auVar21._4_4_ = auVar54._0_4_;
          auVar21._0_4_ = auVar54._0_4_;
          auVar21._8_4_ = auVar54._8_4_;
          auVar21._12_4_ = auVar54._8_4_;
          auVar63 = pshuflw(auVar79,auVar21,0xe8);
          auVar44._0_4_ = -(uint)(auVar58._0_4_ == iVar57);
          auVar44._4_4_ = -(uint)(auVar58._4_4_ == iVar60);
          auVar44._8_4_ = -(uint)(auVar58._8_4_ == iVar61);
          auVar44._12_4_ = -(uint)(auVar58._12_4_ == iVar62);
          auVar73._4_4_ = auVar44._4_4_;
          auVar73._0_4_ = auVar44._4_4_;
          auVar73._8_4_ = auVar44._12_4_;
          auVar73._12_4_ = auVar44._12_4_;
          auVar58 = pshuflw(auVar44,auVar73,0xe8);
          auVar74._4_4_ = auVar54._4_4_;
          auVar74._0_4_ = auVar54._4_4_;
          auVar74._8_4_ = auVar54._12_4_;
          auVar74._12_4_ = auVar54._12_4_;
          auVar38 = pshuflw(auVar54,auVar74,0xe8);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar58 = packssdw(auVar58 & auVar63,(auVar38 | auVar58 & auVar63) ^ auVar8);
          auVar58 = packsswb(auVar58,auVar58);
          if ((auVar58 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            this[1].holes.holes[uVar34 + uVar36 + 4] = '\x01';
          }
          auVar22._4_4_ = auVar54._0_4_;
          auVar22._0_4_ = auVar54._0_4_;
          auVar22._8_4_ = auVar54._8_4_;
          auVar22._12_4_ = auVar54._8_4_;
          auVar74 = auVar73 & auVar22 | auVar74;
          auVar38 = packssdw(auVar74,auVar74);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar58 = packssdw(auVar58,auVar38 ^ auVar9);
          auVar58 = packsswb(auVar58,auVar58);
          if ((auVar58._12_2_ >> 8 & 1) != 0) {
            this[1].holes.holes[uVar34 + uVar36 + 5] = '\x01';
          }
          auVar58 = (auVar55 | _DAT_00264690) ^ auVar29;
          auVar45._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
          auVar45._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
          auVar45._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
          auVar45._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
          auVar75._4_4_ = auVar45._0_4_;
          auVar75._0_4_ = auVar45._0_4_;
          auVar75._8_4_ = auVar45._8_4_;
          auVar75._12_4_ = auVar45._8_4_;
          auVar56._4_4_ = -(uint)(auVar58._4_4_ == iVar60);
          auVar56._12_4_ = -(uint)(auVar58._12_4_ == iVar62);
          auVar56._0_4_ = auVar56._4_4_;
          auVar56._8_4_ = auVar56._12_4_;
          auVar59._4_4_ = auVar45._4_4_;
          auVar59._0_4_ = auVar45._4_4_;
          auVar59._8_4_ = auVar45._12_4_;
          auVar59._12_4_ = auVar45._12_4_;
          auVar38 = auVar56 & auVar75 | auVar59;
          auVar58 = packssdw(auVar45,auVar38);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar58 = packssdw(auVar58 ^ auVar10,auVar58 ^ auVar10);
          auVar58 = packsswb(auVar58,auVar58);
          if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            this[2].holes.holes[uVar34 + uVar36 + -2] = '\x01';
          }
          auVar58 = pshufhw(auVar58,auVar75,0x84);
          auVar38 = pshufhw(auVar38,auVar56,0x84);
          in_XMM2 = auVar38 & auVar58;
          auVar58 = pshufhw(auVar58,auVar59,0x84);
          auVar46._8_4_ = 0xffffffff;
          auVar46._0_8_ = 0xffffffffffffffff;
          auVar46._12_4_ = 0xffffffff;
          auVar46 = (auVar58 | in_XMM2) ^ auVar46;
          auVar58 = packssdw(auVar46,auVar46);
          in_XMM1 = packsswb(auVar58,auVar58);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            this[2].holes.holes[uVar34 + uVar36 + -1] = '\x01';
          }
          uVar34 = uVar34 + 0x10;
        } while ((lVar32 + 0xfU & 0xfffffffffffffff0) != uVar34);
      }
      this->lgSizeUsed = bVar35 + 1;
      uVar31 = 1;
    }
  }
  return (location->offset << ((char)location->lgSize - bVar35 & 0x1f)) + uVar31;
}

Assistant:

uint allocateFromHole(Group& group, Union::DataLocation& location, uint lgSize) {
        // Allocate the given space from an existing hole, given smallestHoleAtLeast() already
        // returned non-null indicating such a hole exists.

        uint result;

        if (!isUsed) {
          // The location is totally unused, so just allocate from the beginning.
          KJ_DASSERT(lgSize <= location.lgSize, "Did smallestHoleAtLeast() really find a hole?");
          result = 0;
          isUsed = true;
          lgSizeUsed = lgSize;
        } else if (lgSize >= lgSizeUsed) {
          // Requested size is at least our current usage, so clearly won't fit in any holes.
          // We must expand to double the requested size, and return the second half.
          KJ_DASSERT(lgSize < location.lgSize, "Did smallestHoleAtLeast() really find a hole?");
          holes.addHolesAtEnd(lgSizeUsed, 1, lgSize);
          lgSizeUsed = lgSize + 1;
          result = 1;
        } else KJ_IF_MAYBE(hole, holes.tryAllocate(lgSize)) {
          // Found a hole.
          result = *hole;
        } else {
          // The requested size is smaller than what we're using so far, but didn't fit in a
          // hole.  We should double our "used" size, then allocate from the new space.
          KJ_DASSERT(lgSizeUsed < location.lgSize,
                     "Did smallestHoleAtLeast() really find a hole?");
          result = 1 << (lgSizeUsed - lgSize);
          holes.addHolesAtEnd(lgSize, result + 1, lgSizeUsed);
          lgSizeUsed += 1;
        }